

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
* Lexer::tokenize(vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
                  *__return_storage_ptr__,string *input)

{
  bool bVar1;
  Type type;
  string token;
  Lexer lexer;
  Type local_84;
  string local_80;
  Lexer local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lexer::Type>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  Lexer(&local_60,input);
  while( true ) {
    bVar1 = Lexer::token(&local_60,&local_80,&local_84);
    if (!bVar1) break;
    std::
    vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
    ::emplace_back<std::__cxx11::string&,Lexer::Type&>
              ((vector<std::tuple<std::__cxx11::string,Lexer::Type>,std::allocator<std::tuple<std::__cxx11::string,Lexer::Type>>>
                *)__return_storage_ptr__,&local_80,&local_84);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector <std::tuple <std::string, Lexer::Type>> Lexer::tokenize (const std::string& input)
{
  std::vector <std::tuple <std::string, Lexer::Type>> tokens;

  std::string token;
  Lexer::Type type;
  Lexer lexer (input);
  while (lexer.token (token, type))
    tokens.emplace_back (token, type);

  return tokens;
}